

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O0

YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  longlong lVar5;
  longlong lVar6;
  int in_EDI;
  long in_FS_OFFSET;
  YearMonthDay YVar7;
  int day;
  int month;
  int y;
  int yearOffset;
  int m;
  int dayInYear;
  int yearInCentury;
  int dayInCentury;
  qint64 century;
  qint64 dayNumber;
  longlong in_stack_ffffffffffffff80;
  int local_74;
  YearMonthDay local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = QRoundingDown::qDiv<146097u,long_long>(in_stack_ffffffffffffff80);
  lVar6 = QRoundingDown::qDiv<4u,long_long>(in_stack_ffffffffffffff80);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  iVar1 = QRoundingDown::qDiv<1461u,int>(uVar4);
  uVar2 = QRoundingDown::qDiv<4u,unsigned_int>(uVar4);
  iVar3 = QRoundingDown::qDiv<153u,int>(uVar4);
  local_74 = (int)lVar5 * 100 + iVar1 + (uint)(9 < iVar3);
  uVar4 = QRoundingDown::qDiv<5u,unsigned_int>(uVar4);
  if (local_74 < 1) {
    local_74 = local_74 + -1;
  }
  QCalendar::YearMonthDay::YearMonthDay
            (&local_14,local_74,iVar3 + 3 + (uint)(9 < iVar3) * -0xc,
             (((in_EDI + -0x1a431f) - (int)lVar6) - uVar2) - uVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    YVar7.day = local_14.day;
    YVar7.year = local_14.year;
    YVar7.month = local_14.month;
    return YVar7;
  }
  __stack_chk_fail();
}

Assistant:

QCalendar::YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)
{
    const qint64 dayNumber = jd - BaseJd;
    const qint64 century = qDiv<FourCenturies>(4 * dayNumber - 1);
    const int dayInCentury = dayNumber - qDiv<4>(FourCenturies * century);

    const int yearInCentury = qDiv<FourYears>(4 * dayInCentury - 1);
    const int dayInYear = dayInCentury - qDiv<4>(FourYears * yearInCentury);
    const int m = qDiv<FiveMonths>(5 * dayInYear - 3);
    Q_ASSERT(m < 12 && m >= 0);
    // That m is a month adjusted to March = 0, with Jan = 10, Feb = 11 in the previous year.
    const int yearOffset = m < 10 ? 0 : 1;

    const int y = 100 * century + yearInCentury + yearOffset;
    const int month = m + 3 - 12 * yearOffset;
    const int day = dayInYear - qDiv<5>(FiveMonths * m + 2);

    // Adjust for no year 0
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, month, day);
}